

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationfastlatinbuilder.cpp
# Opt level: O2

int32_t icu_63::anon_unknown_8::binarySearch(int64_t *list,int32_t limit,int64_t ce)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  if (limit == 0) {
    return -1;
  }
  uVar1 = 0;
  do {
    while( true ) {
      uVar2 = uVar1;
      uVar3 = (int)(limit + uVar2) / 2;
      if (list[(int)uVar3] == ce) {
        return uVar3;
      }
      if ((ulong)ce < (ulong)list[(int)uVar3]) break;
      uVar1 = uVar3;
      if (uVar3 == uVar2) {
        return -2 - uVar2;
      }
    }
    limit = uVar3;
    uVar1 = uVar2;
  } while (uVar3 != uVar2);
  return ~uVar2;
}

Assistant:

int32_t
binarySearch(const int64_t list[], int32_t limit, int64_t ce) {
    if (limit == 0) { return ~0; }
    int32_t start = 0;
    for (;;) {
        int32_t i = (start + limit) / 2;
        int32_t cmp = compareInt64AsUnsigned(ce, list[i]);
        if (cmp == 0) {
            return i;
        } else if (cmp < 0) {
            if (i == start) {
                return ~start;  // insert ce before i
            }
            limit = i;
        } else {
            if (i == start) {
                return ~(start + 1);  // insert ce after i
            }
            start = i;
        }
    }
}